

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O1

uint8_t * apx_attributeParser_parse_port_attributes
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_portAttributes_t *attr)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  bool bVar3;
  int iVar4;
  uint8_t *pBegin;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *next;
  
  if (((end == (uint8_t *)0x0) || (begin == (uint8_t *)0x0)) || (end < begin)) {
    if (self == (apx_attributeParser_t *)0x0) {
LAB_00122e4a:
      __assert_fail("self != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                    ,0x17a,
                    "void apx_attributeParser_set_error(apx_attributeParser_t *, apx_error_t, const uint8_t *)"
                   );
    }
    self->last_error = 1;
    self->error_next = (uint8_t *)0x0;
    begin = (uint8_t *)0x0;
  }
  else {
    do {
      if (end <= begin) {
        return begin;
      }
      begin = bstr_lstrip(begin,end);
      if (begin == end) {
        return begin;
      }
      uVar2 = *begin;
      if (uVar2 == '=') {
        bVar3 = false;
        iVar4 = 3;
      }
      else {
        if (uVar2 == 'Q') {
          iVar4 = 5;
        }
        else {
          if (uVar2 != 'P') {
            iVar4 = 0;
            bVar3 = true;
            goto LAB_00122ce4;
          }
          iVar4 = 4;
        }
        bVar3 = false;
      }
LAB_00122ce4:
      if (bVar3) {
LAB_00122dcd:
        if (self == (apx_attributeParser_t *)0x0) goto LAB_00122e4a;
        self->last_error = 3;
        self->error_next = begin;
LAB_00122ddd:
        pBegin = (uint8_t *)0x0;
      }
      else {
        if (iVar4 != 5) {
          if (iVar4 == 4) {
            attr->is_parameter = true;
            pBegin = begin + 1;
            goto LAB_00122dc8;
          }
          if (iVar4 == 3) {
            pBegin = apx_attributeParser_parse_initializer(self,begin + 1,end,&attr->init_value);
            goto LAB_00122dc8;
          }
          if (self != (apx_attributeParser_t *)0x0) {
            self->last_error = 6;
            self->error_next = (uint8_t *)0x0;
            goto LAB_00122ddd;
          }
          goto LAB_00122e4a;
        }
        puVar1 = begin + 1;
        if (puVar1 < end) {
          if (*puVar1 == '[') {
            puVar5 = bstr_lstrip(begin + 2,end);
            pBegin = puVar1;
            if (puVar5 < end) {
              pBegin = apx_parserBase_parse_u32(puVar5,end,&attr->queue_length);
              if (puVar5 < pBegin) {
                puVar6 = bstr_lstrip(pBegin,end);
                puVar5 = (uint8_t *)0x1;
                if (puVar6 < end) {
                  puVar5 = (uint8_t *)0x0;
                  pBegin = puVar6 + 1;
                  if (*puVar6 != ']') {
                    pBegin = puVar5;
                  }
                }
              }
              else {
                puVar5 = (uint8_t *)0x0;
                pBegin = (uint8_t *)0x0;
              }
              if ((char)puVar5 != '\0') goto LAB_00122dc5;
            }
          }
          else {
            pBegin = (uint8_t *)0x0;
          }
        }
        else {
LAB_00122dc5:
          pBegin = puVar1;
        }
LAB_00122dc8:
        if (pBegin <= begin) goto LAB_00122dcd;
      }
      if ((begin < pBegin) && (begin = bstr_lstrip(pBegin,end), begin != end)) {
        if (*begin != ',') {
          if (self != (apx_attributeParser_t *)0x0) {
            self->last_error = 3;
            self->error_next = begin;
            begin = (uint8_t *)0x0;
            goto LAB_00122e15;
          }
          goto LAB_00122e4a;
        }
        begin = begin + 1;
        bVar3 = true;
      }
      else {
LAB_00122e15:
        bVar3 = false;
      }
    } while (bVar3);
  }
  return begin;
}

Assistant:

uint8_t const* apx_attributeParser_parse_port_attributes(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_portAttributes_t* attr)
{
   uint8_t const* next = begin;
   if ((end < begin) || (begin == NULL) || (end == NULL))
   {
      apx_attributeParser_set_error(self, APX_INVALID_ARGUMENT_ERROR, NULL);
      return NULL;
   }
   while (next < end)
   {
      next = bstr_lstrip(next, end);
      if (next == end)
      {
         break;
      }
      uint8_t const* result = apx_attributeParser_parse_single_port_attribute(self, next, end, attr);
      if (result > next)
      {
         next = bstr_lstrip(result, end);
         if (next == end)
         {
            break;
         }
         if (*next == ',')
         {
            next++;
         }
         else
         {
            apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
            next = NULL;
            break;
         }
      }
      else
      {
         break;
      }
   }
   return next;

}